

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_shift_right(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *s;
  size_t sVar2;
  size_t sVar3;
  size_t k_1;
  size_t mycount;
  size_t k;
  size_t s2;
  size_t s1;
  int power;
  bitset_t *b;
  size_t sh;
  size_t in_stack_ffffffffffffffb8;
  bitset_t *in_stack_ffffffffffffffc0;
  bitset_t *local_30;
  bitset_t *bitset_00;
  ulong local_8;
  
  local_8 = 0;
  while( true ) {
    if (0xff < local_8) {
      return;
    }
    bitset = bitset_create();
    s = (bitset_t *)(local_8 + 0x13ec);
    local_30 = (bitset_t *)(local_8 + 100);
    bitset_00 = local_30;
    for (; local_30 < s; local_30 = (bitset_t *)((long)&local_30->array + 1)) {
      bitset_set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    sVar2 = bitset_count(in_stack_ffffffffffffffc0);
    bitset_shift_right(bitset_00,(size_t)s);
    sVar3 = bitset_count(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = bitset_00;
    if (sVar3 != sVar2) break;
    for (; in_stack_ffffffffffffffc0 < s;
        in_stack_ffffffffffffffc0 = (bitset_t *)((long)&in_stack_ffffffffffffffc0->array + 1)) {
      _Var1 = bitset_get(bitset,(long)in_stack_ffffffffffffffc0 * 3 - local_8);
      if (!_Var1) {
        fprintf(_stderr,"Assertion failed in %s at line %d\n","test_shift_right",0x6f);
        exit(1);
      }
    }
    bitset_free((bitset_t *)0x101a88);
    local_8 = local_8 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_shift_right",0x6d);
  exit(1);
}

Assistant:

void test_shift_right() {
  for (size_t sh = 0; sh < 256; sh++) {
    bitset_t *b = bitset_create();
    int power = 3;
    size_t s1 = 100 + sh;
    size_t s2 = s1 + 5000;
    for (size_t k = s1; k < s2; ++k) {
      bitset_set(b, power * k);
    }
    size_t mycount = bitset_count(b);
    bitset_shift_right(b, sh);
    TEST_ASSERT(bitset_count(b) == mycount);
    for (size_t k = s1; k < s2; ++k) {
      TEST_ASSERT(bitset_get(b, power * k - sh));
    }
    bitset_free(b);
  }
}